

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void refreshZonedDateTime(QDateTimeData *d,QTimeZone *zone,TransitionOptions resolve)

{
  bool bVar1;
  QFlags<QDateTimePrivate::StatusFlag> flags;
  Int IVar2;
  QDateTimeData *zone_00;
  QDateTimePrivate *pQVar3;
  undefined8 in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  qint64 msecs;
  int offsetFromUtc;
  StatusFlags status;
  ZoneState state;
  undefined4 in_stack_ffffffffffffff98;
  StatusFlag in_stack_ffffffffffffff9c;
  QDateTimeData *in_stack_ffffffffffffffa0;
  int local_4c;
  StatusFlag flag;
  QFlagsStorage<QDateTimePrivate::StatusFlag> local_28 [2];
  QDateTimeData *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0].i = 0xaaaaaaaa;
  local_28[0].i = (Int)getStatus(in_stack_ffffffffffffffa0);
  local_4c = 0;
  flags = operator|((enum_type)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                    (enum_type)in_stack_ffffffffffffffa0);
  bVar1 = QFlags<QDateTimePrivate::StatusFlag>::testFlags
                    ((QFlags<QDateTimePrivate::StatusFlag> *)local_28,flags);
  if (bVar1) {
    zone_00 = (QDateTimeData *)
              getMSecs((QDateTimeData *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_20 = (QDateTimeData *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    stateAtMillis((QTimeZone *)&zone_00->data,(qint64)in_stack_ffffffffffffffa0,
                  (QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>)
                  SUB84((ulong)in_RSI >> 0x20,0));
    bVar1 = SUB81((ulong)in_RSI >> 0x18,0);
    flag = (StatusFlag)((ulong)in_RSI >> 0x20);
    if (local_18._4_4_ == -1) {
      QFlags<QDateTimePrivate::StatusFlag>::setFlag
                ((QFlags<QDateTimePrivate::StatusFlag> *)&in_RDI->data,flag,bVar1);
    }
    else if (((ulong)local_10 & 1) == 0) {
      QFlags<QDateTimePrivate::StatusFlag>::setFlag
                ((QFlags<QDateTimePrivate::StatusFlag> *)&in_RDI->data,flag,bVar1);
    }
    else {
      local_28[0].i =
           (Int)mergeDaylightStatus((QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)
                                    SUB84(zone_00,0),
                                    (DaylightStatus)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      local_4c = (int)local_18;
      QFlags<QDateTimePrivate::StatusFlag>::setFlag
                ((QFlags<QDateTimePrivate::StatusFlag> *)&in_RDI->data,
                 (StatusFlag)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
      if (zone_00 != local_20) {
        bVar1 = QFlags<QDateTimePrivate::StatusFlag>::testFlag
                          ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffffa0->data,
                           in_stack_ffffffffffffff9c);
        if (bVar1) {
          bVar1 = msecsCanBeSmall((qint64)in_stack_ffffffffffffffa0);
          if (bVar1) {
            in_RDI->d = (QDateTimePrivate *)((ulong)in_RDI->d & 0xff | (long)local_20 << 8);
          }
          else {
            QFlags<QDateTimePrivate::StatusFlag>::setFlag
                      ((QFlags<QDateTimePrivate::StatusFlag> *)&in_RDI->data,
                       (StatusFlag)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
            QDateTime::Data::detach(in_RDI);
          }
        }
        bVar1 = QFlags<QDateTimePrivate::StatusFlag>::testFlag
                          ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffffa0->data,
                           in_stack_ffffffffffffff9c);
        if (!bVar1) {
          in_stack_ffffffffffffffa0 = local_20;
          pQVar3 = QDateTime::Data::operator->((Data *)&in_RDI->data);
          pQVar3->m_msecs = (qint64)in_stack_ffffffffffffffa0;
        }
      }
    }
  }
  else {
    QFlags<QDateTimePrivate::StatusFlag>::setFlag
              ((QFlags<QDateTimePrivate::StatusFlag> *)&in_RDI->data,
               (StatusFlag)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  }
  bVar1 = QFlags<QDateTimePrivate::StatusFlag>::testFlag
                    ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffffa0->data,
                     in_stack_ffffffffffffff9c);
  if (bVar1) {
    IVar2 = QFlags<QDateTimePrivate::StatusFlag>::toInt
                      ((QFlags<QDateTimePrivate::StatusFlag> *)local_28);
    in_RDI->d = (QDateTimePrivate *)((ulong)in_RDI->d & 0xffffffffffffff00 | (ulong)IVar2 & 0xff);
  }
  else {
    pQVar3 = QDateTime::Data::operator->((Data *)&in_RDI->data);
    (pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = local_28[0].i;
    pQVar3 = QDateTime::Data::operator->((Data *)&in_RDI->data);
    pQVar3->m_offsetFromUtc = local_4c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void refreshZonedDateTime(QDateTimeData &d, const QTimeZone &zone,
                                 QDateTimePrivate::TransitionOptions resolve)
{
    Q_ASSERT(zone.timeSpec() == Qt::TimeZone || zone.timeSpec() == Qt::LocalTime);
    auto status = getStatus(d);
    Q_ASSERT(extractSpec(status) == zone.timeSpec());
    int offsetFromUtc = 0;
    /* Callers are:
       * QDTP::create(), where d is too new to be shared yet
       * reviseTimeZone(), which detach()es if not short before calling this
       * checkValidDateTime(), always follows a setDateTime() that detach()ed if not short

       So we can assume d is not shared. We only need to detach() if we convert
       from short to pimpled to accommodate an oversize msecs, which can only be
       needed in the unlikely event we revise it.
    */

    // If not valid date and time then is invalid
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime)) {
        status.setFlag(QDateTimePrivate::ValidDateTime, false);
    } else {
        // We have a valid date and time and a Qt::LocalTime or Qt::TimeZone
        // that might fall into a "missing" DST transition hour.
        qint64 msecs = getMSecs(d);
        QDateTimePrivate::ZoneState state = stateAtMillis(zone, msecs, resolve);
        Q_ASSERT(!state.valid || (state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY));
        if (state.dst == QDateTimePrivate::UnknownDaylightTime) { // Overflow
            status.setFlag(QDateTimePrivate::ValidDateTime, false);
        } else if (state.valid) {
            status = mergeDaylightStatus(status, state.dst);
            offsetFromUtc = state.offset;
            status.setFlag(QDateTimePrivate::ValidDateTime, true);
            if (Q_UNLIKELY(msecs != state.when)) {
                // Update msecs to the resolution:
                if (status.testFlag(QDateTimePrivate::ShortData)) {
                    if (msecsCanBeSmall(state.when)) {
                        d.data.msecs = qintptr(state.when);
                    } else {
                        // Convert to long-form so we can hold the revised msecs:
                        status.setFlag(QDateTimePrivate::ShortData, false);
                        d.detach();
                    }
                }
                if (!status.testFlag(QDateTimePrivate::ShortData))
                    d->m_msecs = state.when;
            }
        } else {
            status.setFlag(QDateTimePrivate::ValidDateTime, false);
        }
    }

    if (status.testFlag(QDateTimePrivate::ShortData)) {
        d.data.status = status.toInt();
    } else {
        d->m_status = status;
        d->m_offsetFromUtc = offsetFromUtc;
    }
}